

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_fpu_helper.c
# Opt level: O2

void vfll32(S390Vector *v1,S390Vector *v2,CPUS390XState_conflict *env,_Bool s,uintptr_t retaddr)

{
  uint8_t vxc;
  float64 fVar1;
  long lVar2;
  uint8_t vec_exc;
  S390Vector tmp;
  uint8_t local_59;
  uintptr_t local_58;
  S390Vector *local_50;
  float64 local_48;
  uint64_t uStack_40;
  
  local_59 = '\0';
  local_48 = 0;
  uStack_40 = 0;
  lVar2 = 0;
  local_58 = retaddr;
  local_50 = v1;
  while (lVar2 != 4) {
    fVar1 = float32_to_float64_s390x(*(float32 *)((long)v2 + lVar2 * 4 + 4),&env->fpu_status);
    *(float64 *)((long)&local_48 + lVar2 * 4) = fVar1;
    vxc = check_ieee_exc(env,(uint8_t)lVar2,false,&local_59);
    if ((s) || (lVar2 = lVar2 + 2, vxc != '\0')) goto LAB_00b008c9;
  }
  vxc = '\0';
LAB_00b008c9:
  handle_ieee_exc(env,vxc,local_59,local_58);
  local_50->doubleword[0] = local_48;
  local_50->doubleword[1] = uStack_40;
  return;
}

Assistant:

static void vfll32(S390Vector *v1, const S390Vector *v2, CPUS390XState *env,
                   bool s, uintptr_t retaddr)
{
    uint8_t vxc, vec_exc = 0;
    S390Vector tmp = { 0 };
    int i;

    for (i = 0; i < 2; i++) {
        /* load from even element */
        const float32 a = s390_vec_read_element32(v2, i * 2);
        const uint64_t ret = float32_to_float64(a, &env->fpu_status);

        s390_vec_write_element64(&tmp, i, ret);
        /* indicate the source element */
        vxc = check_ieee_exc(env, i * 2, false, &vec_exc);
        if (s || vxc) {
            break;
        }
    }
    handle_ieee_exc(env, vxc, vec_exc, retaddr);
    *v1 = tmp;
}